

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

wb_tree * wb_tree_new(dict_compare_func cmp_func)

{
  wb_tree *pwVar1;
  wb_tree *tree;
  dict_compare_func cmp_func_local;
  
  if (cmp_func == (dict_compare_func)0x0) {
    fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
            ,0x7e,"wb_tree_new","cmp_func != NULL");
    abort();
  }
  pwVar1 = (wb_tree *)(*dict_malloc_func)(0x20);
  if (pwVar1 != (wb_tree *)0x0) {
    pwVar1->root = (wb_node *)0x0;
    pwVar1->count = 0;
    pwVar1->cmp_func = cmp_func;
    pwVar1->rotation_count = 0;
  }
  return pwVar1;
}

Assistant:

wb_tree*
wb_tree_new(dict_compare_func cmp_func)
{
    ASSERT(cmp_func != NULL);

    wb_tree* tree = MALLOC(sizeof(*tree));
    if (tree) {
	tree->root = NULL;
	tree->count = 0;
	tree->cmp_func = cmp_func;
	tree->rotation_count = 0;
    }
    return tree;
}